

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

void session_destroy_link_endpoint(LINK_ENDPOINT_HANDLE link_endpoint)

{
  LINK_ENDPOINT_INSTANCE *endpoint_instance;
  LINK_ENDPOINT_HANDLE link_endpoint_local;
  
  if (link_endpoint != (LINK_ENDPOINT_HANDLE)0x0) {
    if (link_endpoint->link_endpoint_state == LINK_ENDPOINT_STATE_ATTACHED) {
      link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_DETACHING;
    }
    else {
      remove_link_endpoint(link_endpoint);
      free_link_endpoint(link_endpoint);
    }
  }
  return;
}

Assistant:

void session_destroy_link_endpoint(LINK_ENDPOINT_HANDLE link_endpoint)
{
    if (link_endpoint != NULL)
    {
        LINK_ENDPOINT_INSTANCE* endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;

        if (endpoint_instance->link_endpoint_state == LINK_ENDPOINT_STATE_ATTACHED)
        {
            endpoint_instance->link_endpoint_state = LINK_ENDPOINT_STATE_DETACHING;
        }
        else
        {
            remove_link_endpoint(link_endpoint);
            free_link_endpoint(link_endpoint);
        }
    }
}